

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O3

void __thiscall
TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test::
TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test
          (TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test *this)

{
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture.ownsExecFunction_ = 0
  ;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture.output_ =
       (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture.registry_ = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture.genTest_ =
       (ExecFunctionTestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture._vptr_TestTestingFixture =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture.result_ = (TestResult *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupUnitTestMacros_0038df68;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture);
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupUnitTestMacros_0038c678;
  return;
}

Assistant:

TEST(UnitTestMacros, FailureWithSIGNED_BYTES_EQUAL)
{
    fixture.runTestWithMethod(failingTestMethodWithSIGNED_BYTES_EQUAL_);
#if CPPUTEST_CHAR_BIT == 16
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xffff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfffe)>");
#elif CPPUTEST_CHAR_BIT == 8
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfe)>");
#endif
}